

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_file_system.cpp
# Opt level: O2

BufferHandle * __thiscall
duckdb::CachingFileHandle::Read
          (BufferHandle *__return_storage_ptr__,CachingFileHandle *this,data_ptr_t *buffer,
          idx_t nr_bytes,idx_t location)

{
  BufferManager *pBVar1;
  bool bVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  FileHandle *pFVar5;
  shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> *new_file_range_00;
  shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> *extraout_RDX;
  shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> *new_file_range_01;
  idx_t location_local;
  idx_t nr_bytes_local;
  BufferHandle result;
  vector<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_true>
  overlapping_ranges;
  shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> new_file_range;
  
  location_local = location;
  nr_bytes_local = nr_bytes;
  BufferHandle::BufferHandle(&result);
  iVar4 = nr_bytes_local;
  if (((this->external_file_cache->enable)._M_base._M_i & 1U) == 0) {
    pBVar1 = this->external_file_cache->buffer_manager;
    (*pBVar1->_vptr_BufferManager[4])(&overlapping_ranges,pBVar1,0xd,nr_bytes_local,1);
    BufferHandle::operator=(&result,(BufferHandle *)&overlapping_ranges);
    BufferHandle::~BufferHandle((BufferHandle *)&overlapping_ranges);
    pdVar3 = BufferHandle::Ptr(&result);
    *buffer = pdVar3;
    pFVar5 = GetFileHandle(this);
    FileHandle::Read(pFVar5,*buffer,iVar4,location_local);
    BufferHandle::BufferHandle(__return_storage_ptr__,&result);
    goto LAB_01ac05ea;
  }
  overlapping_ranges.
  super_vector<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  overlapping_ranges.
  super_vector<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  overlapping_ranges.
  super_vector<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  TryReadFromCache((BufferHandle *)&new_file_range,this,buffer,nr_bytes_local,location_local,
                   &overlapping_ranges);
  BufferHandle::operator=(&result,(BufferHandle *)&new_file_range);
  BufferHandle::~BufferHandle((BufferHandle *)&new_file_range);
  bVar2 = BufferHandle::IsValid(&result);
  if (bVar2) {
    BufferHandle::BufferHandle(__return_storage_ptr__,&result);
  }
  else {
    pBVar1 = this->external_file_cache->buffer_manager;
    (*pBVar1->_vptr_BufferManager[4])(&new_file_range,pBVar1,0xd,iVar4,1);
    BufferHandle::operator=(&result,(BufferHandle *)&new_file_range);
    BufferHandle::~BufferHandle((BufferHandle *)&new_file_range);
    make_shared_ptr<duckdb::ExternalFileCache::CachedFileRange,duckdb::shared_ptr<duckdb::BlockHandle,true>const&,unsigned_long_const&,unsigned_long_const&,std::__cxx11::string&>
              ((shared_ptr<duckdb::BlockHandle,_true> *)&new_file_range,(unsigned_long *)&result,
               &nr_bytes_local,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&location_local)
    ;
    pdVar3 = BufferHandle::Ptr(&result);
    *buffer = pdVar3;
    bVar2 = OnDiskFile(this);
    pdVar3 = *buffer;
    new_file_range_01 = new_file_range_00;
    if (bVar2) {
LAB_01ac0582:
      ReadAndCopyInterleaved
                (this,&overlapping_ranges,new_file_range_01,pdVar3,nr_bytes_local,location_local,
                 true);
    }
    else {
      iVar4 = ReadAndCopyInterleaved
                        (this,&overlapping_ranges,new_file_range_00,pdVar3,nr_bytes_local,
                         location_local,false);
      if (iVar4 < 2) {
        pdVar3 = *buffer;
        new_file_range_01 = extraout_RDX;
        goto LAB_01ac0582;
      }
      pFVar5 = GetFileHandle(this);
      FileHandle::Read(pFVar5,*buffer,nr_bytes_local,location_local);
    }
    TryInsertFileRange(__return_storage_ptr__,this,&result,buffer,nr_bytes_local,location_local,
                       &new_file_range);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&new_file_range.internal.
                super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  ::std::
  vector<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>
  ::~vector(&overlapping_ranges.
             super_vector<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>
           );
LAB_01ac05ea:
  BufferHandle::~BufferHandle(&result);
  return __return_storage_ptr__;
}

Assistant:

BufferHandle CachingFileHandle::Read(data_ptr_t &buffer, const idx_t nr_bytes, const idx_t location) {
	BufferHandle result;
	if (!external_file_cache.IsEnabled()) {
		result = external_file_cache.GetBufferManager().Allocate(MemoryTag::EXTERNAL_FILE_CACHE, nr_bytes);
		buffer = result.Ptr();
		GetFileHandle().Read(buffer, nr_bytes, location);
		return result;
	}

	// Try to read from the cache, filling overlapping_ranges in the process
	vector<shared_ptr<CachedFileRange>> overlapping_ranges;
	result = TryReadFromCache(buffer, nr_bytes, location, overlapping_ranges);
	if (result.IsValid()) {
		return result; // Success
	}

	// Finally, if we weren't able to find the file range in the cache, we have to create a new file range
	result = external_file_cache.GetBufferManager().Allocate(MemoryTag::EXTERNAL_FILE_CACHE, nr_bytes);
	auto new_file_range = make_shared_ptr<CachedFileRange>(result.GetBlockHandle(), nr_bytes, location, version_tag);
	buffer = result.Ptr();

	// Interleave reading and copying from cached buffers
	if (OnDiskFile()) {
		// On-disk file: prefer interleaving reading and copying from cached buffers
		ReadAndCopyInterleaved(overlapping_ranges, new_file_range, buffer, nr_bytes, location, true);
	} else {
		// Remote file: prefer interleaving reading and copying from cached buffers only if reduces number of real reads
		if (ReadAndCopyInterleaved(overlapping_ranges, new_file_range, buffer, nr_bytes, location, false) <= 1) {
			ReadAndCopyInterleaved(overlapping_ranges, new_file_range, buffer, nr_bytes, location, true);
		} else {
			GetFileHandle().Read(buffer, nr_bytes, location);
		}
	}

	return TryInsertFileRange(result, buffer, nr_bytes, location, new_file_range);
}